

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O1

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteSparseArrayIndexProperties<Js::ES5ArrayIndexStaticEnumerator<false>,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,ArrayType *arr)

{
  ScriptContext *requestContext;
  uint32 uVar1;
  bool bVar2;
  BOOL BVar3;
  Engine *this_00;
  undefined1 local_68 [8];
  ES5ArrayIndexStaticEnumerator<false> e;
  Var value;
  uint unused;
  
  requestContext =
       (this->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  e.m_array._0_4_ = (arr->super_JavascriptArray).super_ArrayObject.length;
  e._4_8_ = 0xffffffffffffffff;
  e.m_index = 0xffffffff;
  e.m_dataIndex = 0;
  e.m_descriptorIndex = 0;
  e.m_descriptor = (IndexPropertyDescriptor *)0x0;
  e.m_descriptorValidationToken = (void *)0x0;
  local_68 = (undefined1  [8])arr;
  bVar2 = ES5ArrayIndexStaticEnumerator<false>::MoveNext
                    ((ES5ArrayIndexStaticEnumerator<false> *)local_68,(PropertyAttributes *)0x0);
  if (bVar2) {
    do {
      uVar1 = e.m_array._4_4_;
      BVar3 = JavascriptOperators::GetOwnItem
                        ((RecyclableObject *)arr,e.m_array._4_4_,&e.m_descriptorValidationToken,
                         requestContext);
      if (BVar3 != 0) {
        value._4_4_ = uVar1;
        StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&value + 4));
        this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                  ::GetEngine(&this->
                               super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                             );
        SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                  (this_00,e.m_descriptorValidationToken,(uint *)((long)&value + 4));
      }
      bVar2 = ES5ArrayIndexStaticEnumerator<false>::MoveNext
                        ((ES5ArrayIndexStaticEnumerator<false> *)local_68,(PropertyAttributes *)0x0)
      ;
    } while (bVar2);
  }
  value._4_4_ = 0xffffffff;
  StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&value + 4));
  return;
}

Assistant:

void WriteSparseArrayIndexProperties(typename IndexEnumerator::ArrayType* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            IndexEnumerator e(arr);
            Var value = nullptr;

            while (e.MoveNext())
            {
                uint32 i = e.GetIndex();
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    Write(i);
                    this->GetEngine()->Clone(value);
                }
            }

            Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }